

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

char __thiscall
Fl_Preferences::get(Fl_Preferences *this,char *key,void *data,void *defaultValue,int defaultSize,
                   int maxSize)

{
  void *__src;
  int local_7c;
  int local_64;
  void *w;
  char *pcStack_40;
  int dsize;
  char *v;
  int maxSize_local;
  int defaultSize_local;
  void *defaultValue_local;
  void *data_local;
  char *key_local;
  Fl_Preferences *this_local;
  
  v._0_4_ = maxSize;
  v._4_4_ = defaultSize;
  _maxSize_local = defaultValue;
  defaultValue_local = data;
  data_local = key;
  key_local = (char *)this;
  pcStack_40 = Node::get(this->node,key);
  if (pcStack_40 == (char *)0x0) {
    if (_maxSize_local != (void *)0x0) {
      if ((int)v < v._4_4_) {
        local_7c = (int)v;
      }
      else {
        local_7c = v._4_4_;
      }
      memmove(defaultValue_local,_maxSize_local,(long)local_7c);
    }
    this_local._7_1_ = '\0';
  }
  else {
    __src = decodeHex(pcStack_40,(int *)((long)&w + 4));
    if ((int)v < w._4_4_) {
      local_64 = (int)v;
    }
    else {
      local_64 = w._4_4_;
    }
    memmove(defaultValue_local,__src,(long)local_64);
    free(__src);
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

char Fl_Preferences::get( const char *key, void *data, const void *defaultValue, int defaultSize, int maxSize ) {
  const char *v = node->get( key );
  if ( v ) {
    int dsize;
    void *w = decodeHex( v, dsize );
    memmove( data, w, dsize>maxSize?maxSize:dsize );
    free( w );
    return 1;
  }
  if ( defaultValue )
    memmove( data, defaultValue, defaultSize>maxSize?maxSize:defaultSize );
  return 0;
}